

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt.c
# Opt level: O3

void lws_mqtt_publish_resend(lws_sorted_usec_list *sul)

{
  lws_dll2 *plVar1;
  int iVar2;
  
  _lws_log(4,"%s: wsi %p\n","lws_mqtt_publish_resend",sul[1].list.prev);
  plVar1 = sul[1].list.prev;
  iVar2 = (*(code *)(plVar1[0x17].prev)->next)(plVar1,0xd2,plVar1[0x19].owner,0,0);
  if (iVar2 != 0) {
    lws_set_timeout((lws *)sul[1].list.prev,PENDING_TIMEOUT_AWAITING_PROXY_RESPONSE,-1);
    return;
  }
  return;
}

Assistant:

static void
lws_mqtt_publish_resend(struct lws_sorted_usec_list *sul)
{
	struct _lws_mqtt_related *mqtt = lws_container_of(sul,
			struct _lws_mqtt_related, sul_qos1_puback_wait);

	lwsl_notice("%s: wsi %p\n", __func__, mqtt->wsi);

	if (mqtt->wsi->protocol->callback(mqtt->wsi, LWS_CALLBACK_MQTT_RESEND,
				mqtt->wsi->user_space, NULL, 0))
		lws_set_timeout(mqtt->wsi, 1, LWS_TO_KILL_ASYNC);
}